

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thecl06.c
# Opt level: O2

int th06_compile(thecl_t *ecl,FILE *out)

{
  int iVar1;
  ulong uVar2;
  void *pvVar3;
  int *piVar4;
  undefined1 uVar5;
  ushort uVar6;
  undefined2 uVar7;
  int iVar8;
  uint32_t uVar9;
  int32_t iVar10;
  long lVar11;
  list_node_t *plVar12;
  undefined4 *buffer;
  size_t sVar13;
  char *out_00;
  char *pcVar14;
  ssize_t sVar15;
  undefined2 *buffer_00;
  uint uVar16;
  uchar uVar17;
  size_t __nmemb;
  thecl_sub_t *sub;
  uint32_t *data;
  uchar *data_00;
  long *plVar18;
  long *plVar19;
  bool bVar20;
  ulong uStack_e0;
  long local_c8;
  undefined2 local_c0;
  ushort local_be;
  uint local_bc;
  void *local_b8;
  thecl_sub_t *local_b0;
  char timeline_sentinel_th6 [4];
  uint32_t magic;
  long local_a0;
  list_node_t *local_98;
  FILE *local_90;
  value_t local_88;
  ulong local_68;
  void *local_60;
  list_node_t *local_58;
  list_node_t *local_50;
  char timeline_sentinel_th8 [8];
  th06_instr_t sentinel;
  
  uVar16 = ecl->version;
  magic = (uVar16 == 9 | 8) << 8;
  uVar2 = ecl->sub_count;
  local_c0 = (undefined2)uVar2;
  sentinel.time = 0xffffffff;
  sentinel.id = 0xffff;
  sentinel.size = 0xc;
  sentinel.rank_mask = 0xff00;
  sentinel.param_mask = 0xff;
  local_98 = (list_node_t *)&ecl->timelines;
  local_be = 0xffff;
  plVar12 = local_98;
  do {
    plVar12 = plVar12->next;
    local_be = local_be + 1;
  } while (plVar12 != (list_node_t *)0x0);
  if (uVar16 == 6) {
    local_be = 0;
    uStack_e0 = 3;
  }
  else if (uVar16 == 9) {
    uStack_e0 = (ulong)local_be;
  }
  else {
    uStack_e0 = 0x10;
  }
  iVar8 = file_seekable(out);
  if (iVar8 == 0) {
    iVar8 = 0;
    fprintf(_stderr,"%s: output is not seekable\n",argv0);
  }
  else {
    __nmemb = (uVar2 & 0xffff) + uStack_e0;
    local_68 = (ulong)(uint)((int)__nmemb * 4);
    file_seek(out,(ulong)(7 < uVar16) * 4 + 4 + local_68);
    local_b8 = calloc(__nmemb,4);
    local_bc = 0xffff;
    if (ecl->version == 6) {
      local_bc = 0x87;
    }
    local_60 = (void *)((long)local_b8 + uStack_e0 * 4);
    local_a0 = 0;
    plVar12 = (list_node_t *)&ecl->subs;
    local_90 = out;
    while (plVar12 = plVar12->next, plVar12 != (list_node_t *)0x0) {
      sub = (thecl_sub_t *)plVar12->data;
      local_58 = plVar12;
      lVar11 = file_tell(out);
      *(int *)((long)local_60 + local_a0 * 4) = (int)lVar11;
      plVar12 = (list_node_t *)&sub->instrs;
      local_b0 = sub;
      while (plVar12 = plVar12->next, plVar12 != (list_node_t *)0x0) {
        pvVar3 = plVar12->data;
        iVar8 = *(int *)((long)pvVar3 + 0x34);
        local_50 = plVar12;
        buffer = (undefined4 *)malloc((long)iVar8);
        *buffer = *(undefined4 *)((long)pvVar3 + 0x38);
        *(undefined2 *)(buffer + 1) = *(undefined2 *)((long)pvVar3 + 0x10);
        *(short *)((long)buffer + 6) = (short)iVar8;
        if (*(int *)((long)pvVar3 + 0x3c) == 0xff) {
          *(undefined2 *)(buffer + 2) = 0xff00;
          uVar16 = ecl->version;
LAB_00115ccb:
          uVar7 = 0xff;
          if (uVar16 != 6) goto LAB_00115cd4;
        }
        else {
          uVar6 = (ushort)(*(int *)((long)pvVar3 + 0x3c) << 8);
          *(ushort *)(buffer + 2) = uVar6;
          uVar16 = ecl->version;
          if ((uVar16 & 0xfffffffe) == 6) {
            *(ushort *)(buffer + 2) = uVar6 & 0xf00;
            goto LAB_00115ccb;
          }
LAB_00115cd4:
          uVar7 = 0;
        }
        *(undefined2 *)((long)buffer + 10) = uVar7;
        data = buffer + 3;
        plVar18 = (long *)((long)pvVar3 + 0x20);
        iVar8 = 0;
        while (out = local_90, plVar18 = (long *)*plVar18, plVar18 != (long *)0x0) {
          piVar4 = (int *)plVar18[2];
          if (piVar4[8] != 0) {
            *(ushort *)((long)buffer + 10) =
                 *(ushort *)((long)buffer + 10) | (ushort)(1 << ((byte)iVar8 & 0x1f));
          }
          iVar1 = *piVar4;
          if (iVar1 == 0x4e) {
            uVar9 = th06_find_sub(ecl,*(char **)(piVar4 + 4));
LAB_00115d5a:
            *data = uVar9;
            data = data + 1;
          }
          else {
            if (iVar1 == 0x6f) {
              iVar10 = label_offset(sub,*(char **)(piVar4 + 4));
              uVar9 = iVar10 - *(int *)((long)pvVar3 + 0x40);
              goto LAB_00115d5a;
            }
            if (iVar1 == 0x6e) {
              uVar9 = th06_find_sub(ecl,*(char **)(piVar4 + 4));
              *(short *)data = (short)uVar9;
              data = (uint32_t *)((long)data + 2);
            }
            else if (piVar4[2] == 0x7a) {
              pcVar14 = *(char **)(piVar4 + 4);
              if (g_ecl_encode_cp932 == true) {
                sVar13 = utf8_to_cp932_len(pcVar14);
                out_00 = (char *)malloc(sVar13 + 1);
                pcVar14 = utf8_to_cp932(out_00,pcVar14);
              }
              uVar16 = ecl->version;
              if ((uVar16 == 0x5f) || (uVar16 == 7)) {
                data[8] = 0;
                data[9] = 0;
                data[10] = 0;
                data[0xb] = 0;
                data[4] = 0;
                data[5] = 0;
                data[6] = 0;
                data[7] = 0;
                data[0] = 0;
                data[1] = 0;
                data[2] = 0;
                data[3] = 0;
                strncpy((char *)data,pcVar14,0x30);
                uVar17 = 0xaa;
LAB_00115e6e:
                sub = local_b0;
                util_xor((uchar *)data,0x30,uVar17,'\0','\0');
                data = data + 0xc;
              }
              else if (uVar16 == 8) {
                if (iVar8 - 5U < 2) {
                  data[0xc] = 0;
                  data[0xd] = 0;
                  data[0xe] = 0;
                  data[0xf] = 0;
                  data[8] = 0;
                  data[9] = 0;
                  data[10] = 0;
                  data[0xb] = 0;
                  data[4] = 0;
                  data[5] = 0;
                  data[6] = 0;
                  data[7] = 0;
                  data[0] = 0;
                  data[1] = 0;
                  data[2] = 0;
                  data[3] = 0;
                  strncpy((char *)data,pcVar14,0x40);
                  sub = local_b0;
                  uVar17 = 0xee;
                  if (iVar8 == 5) {
                    uVar17 = 0xdd;
                  }
                  util_xor((uchar *)data,0x40,uVar17,'\0','\0');
                  data = data + 0x10;
                }
                else if (iVar8 - 3U < 2) {
                  data[8] = 0;
                  data[9] = 0;
                  data[10] = 0;
                  data[0xb] = 0;
                  data[4] = 0;
                  data[5] = 0;
                  data[6] = 0;
                  data[7] = 0;
                  data[0] = 0;
                  data[1] = 0;
                  data[2] = 0;
                  data[3] = 0;
                  strncpy((char *)data,pcVar14,0x30);
                  uVar17 = 0xbb;
                  if (iVar8 == 3) {
                    uVar17 = 0xaa;
                  }
                  goto LAB_00115e6e;
                }
              }
              else if (uVar16 == 6) {
                data[4] = 0;
                data[5] = 0;
                data[6] = 0;
                data[7] = 0;
                data[0] = 0;
                data[1] = 0;
                data[2] = 0;
                data[3] = 0;
                *(undefined2 *)(data + 8) = 0;
                strncpy((char *)data,pcVar14,0x22);
                data = (uint32_t *)((long)data + 0x22);
              }
              if (g_ecl_encode_cp932 == true) {
                free(pcVar14);
              }
            }
            else {
              local_88.val.m.data = (uchar *)*(undefined8 *)(piVar4 + 6);
              local_88.val.d = (double)*(undefined8 *)(piVar4 + 4);
              local_88._4_4_ = SUB84((ulong)*(undefined8 *)(piVar4 + 2) >> 0x20,0);
              local_88.type = *piVar4;
              sVar15 = value_to_data(&local_88,(uchar *)data,
                                     (long)buffer +
                                     ((long)*(int *)((long)pvVar3 + 0x34) - (long)data));
              data = (uint32_t *)((long)data + sVar15);
            }
          }
          iVar8 = iVar8 + 1;
        }
        file_write(local_90,buffer,(ulong)*(ushort *)((long)buffer + 6));
        if (local_bc < *(ushort *)(buffer + 1)) {
          fprintf(_stderr,"%s: warning: opcode: id %hu was higher than the maximum %hu\n",argv0);
        }
        free(buffer);
        plVar12 = local_50;
      }
      file_write(out,&sentinel,0xc);
      local_a0 = local_a0 + 1;
      plVar12 = local_58;
    }
    timeline_sentinel_th6[0] = -1;
    timeline_sentinel_th6[1] = -1;
    timeline_sentinel_th6[2] = '\x04';
    timeline_sentinel_th6[3] = '\0';
    timeline_sentinel_th8[0] = -1;
    timeline_sentinel_th8[1] = -1;
    timeline_sentinel_th8[2] = -1;
    timeline_sentinel_th8[3] = -1;
    timeline_sentinel_th8[4] = '\0';
    timeline_sentinel_th8[5] = '\0';
    timeline_sentinel_th8[6] = '\0';
    timeline_sentinel_th8[7] = '\0';
    local_c8 = 0;
    while( true ) {
      iVar8 = 1;
      plVar12 = local_98->next;
      if (plVar12 == (list_node_t *)0x0) break;
      pvVar3 = plVar12->data;
      local_98 = plVar12;
      lVar11 = file_tell(out);
      *(int *)((long)local_b8 + local_c8 * 4) = (int)lVar11;
      plVar18 = (long *)((long)pvVar3 + 0x38);
      while (plVar18 = (long *)*plVar18, plVar18 != (long *)0x0) {
        lVar11 = plVar18[2];
        iVar8 = *(int *)(lVar11 + 0x34);
        buffer_00 = (undefined2 *)malloc((long)iVar8);
        *buffer_00 = *(undefined2 *)(lVar11 + 0x38);
        buffer_00[2] = *(undefined2 *)(lVar11 + 0x10);
        *(char *)(buffer_00 + 3) = (char)iVar8;
        if (ecl->version < 8) {
          uVar5 = 0;
        }
        else {
          uVar5 = *(undefined1 *)(lVar11 + 0x3c);
        }
        *(undefined1 *)((long)buffer_00 + 7) = uVar5;
        data_00 = (uchar *)(buffer_00 + 4);
        plVar19 = (long *)(lVar11 + 0x20);
        bVar20 = false;
        while (out = local_90, plVar19 = (long *)*plVar19, plVar19 != (long *)0x0) {
          piVar4 = (int *)plVar19[2];
          if (bVar20) {
            local_88.val.m.data = (uchar *)*(undefined8 *)(piVar4 + 6);
            local_88.val.d = (double)*(undefined8 *)(piVar4 + 4);
            local_88._4_4_ = SUB84((ulong)*(undefined8 *)(piVar4 + 2) >> 0x20,0);
            local_88.type = *piVar4;
            sVar15 = value_to_data(&local_88,data_00,
                                   (long)buffer_00 + ((long)*(int *)(lVar11 + 0x34) - (long)data_00)
                                  );
            data_00 = data_00 + sVar15;
            bVar20 = true;
          }
          else {
            if (*piVar4 == 0x6e) {
              uVar9 = th06_find_sub(ecl,*(char **)(piVar4 + 4));
              uVar7 = (undefined2)uVar9;
            }
            else {
              uVar7 = (undefined2)piVar4[4];
            }
            buffer_00[1] = uVar7;
            bVar20 = true;
          }
        }
        file_write(local_90,buffer_00,(ulong)*(byte *)(buffer_00 + 3));
        free(buffer_00);
      }
      local_c8 = local_c8 + 1;
      bVar20 = 7 < ecl->version;
      pcVar14 = timeline_sentinel_th8;
      if (!bVar20) {
        pcVar14 = timeline_sentinel_th6;
      }
      file_write(out,pcVar14,(ulong)bVar20 * 4 + 4);
    }
    if ((ecl->version != 6) && (ecl->version != 9)) {
      lVar11 = file_tell(out);
      *(int *)((long)local_b8 + local_c8 * 4) = (int)lVar11;
    }
    file_seek(out,0);
    if (7 < ecl->version) {
      file_write(out,&magic,4);
    }
    file_write(out,&local_c0,4);
    pvVar3 = local_b8;
    file_write(out,local_b8,local_68);
    free(pvVar3);
  }
  return iVar8;
}

Assistant:

static int
th06_compile(
    const thecl_t* ecl,
    FILE* out)
{
    const uint32_t magic = ecl->version == 9 ? 0x00000900 : 0x00000800;
    const size_t header_size = sizeof(th06_header_t) + ((ecl->version >= 8) ? sizeof(uint32_t) : 0);

    th06_header_t header = {
        .sub_count = ecl->sub_count
    };
    uint32_t* offsets;
    const th06_instr_t sentinel = {
        .time = 0xffffffff,
        .id = 0xffff,
        .size = sizeof(sentinel),
        .rank_mask = 0xff00,
        .param_mask = 0x00ff
    };

    thecl_timeline_t* iter_timeline;
    list_for_each(&ecl->timelines, iter_timeline)
        ++header.timeline_count;

    size_t timeline_count;
    if (ecl->version == 9)
        timeline_count = header.timeline_count;
    else if (ecl->version == 6) {
        timeline_count = 3;
        header.timeline_count = 0;
    } else
        timeline_count = 16;
    const size_t offset_count = timeline_count + header.sub_count;

    if (!file_seekable(out)) {
        fprintf(stderr, "%s: output is not seekable\n", argv0);
        return 0;
    }

    file_seek(out, header_size + offset_count * sizeof(uint32_t));

    offsets = calloc(offset_count, sizeof(*offsets));

    thecl_sub_t* sub;
    uint16_t max_opcode;
    /* TODO: Get max opcodes for the rest of the games */
    switch (ecl->version)
    {
    case 6:
        max_opcode = 135;
        break;
    default:
        max_opcode = 0xFFFFU;
        break;
    }
    size_t s = 0;
    list_for_each(&ecl->subs, sub) {
        offsets[timeline_count + s] = file_tell(out);

        thecl_instr_t* instr;
        list_for_each(&sub->instrs, instr) {
            th06_instr_t* raw_instr = th06_instr_serialize(ecl, sub, instr);
            file_write(out, raw_instr, raw_instr->size);
            if (raw_instr->id > max_opcode) {
                fprintf(stderr, "%s: warning: opcode: id %hu was higher than the maximum %hu\n", argv0, raw_instr->id, max_opcode);
            }
            free(raw_instr);
        }

        file_write(out, &sentinel, sizeof(sentinel));

        ++s;
    }

    char timeline_sentinel_th6[4] = {0xff, 0xff, 0x04, 0x00};
    char timeline_sentinel_th8[8] = {0xff, 0xff, 0xff, 0xff, 0x00, 0x00, 0x00, 0x00};

    size_t o = 0;
    thecl_sub_t* timeline;
    list_for_each(&ecl->timelines, timeline) {
        offsets[o++] = file_tell(out);

        thecl_instr_t* instr;
        list_for_each(&timeline->instrs, instr) {
            th06_timeline_instr_t* raw_instr = th06_timeline_instr_serialize(ecl, instr);

            file_write(out, raw_instr, raw_instr->size);
            free(raw_instr);
        }

        file_write(out, ecl->version < 8 ? timeline_sentinel_th6 : timeline_sentinel_th8, ecl->version < 8 ? 4 : 8);
    }

    if (ecl->version != 9 && ecl->version != 6)
        offsets[o] = file_tell(out);

    file_seek(out, 0);
    if (ecl->version >= 8)
        file_write(out, &magic, sizeof(magic));
    file_write(out, &header, sizeof(header));
    file_write(out, offsets, offset_count * sizeof(*offsets));
    free(offsets);

    return 1;
}